

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test::TestBody
          (CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test *this)

{
  short sVar1;
  GMM_RESOURCE_FORMAT GVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  AssertHelper local_230;
  Message local_228;
  unsigned_long local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_5;
  GMM_RESOURCE_INFO *AuxResourceInfo;
  Message local_1f0;
  unsigned_long local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  Message local_1c0;
  ulong local_1b8;
  unsigned_long local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_3;
  Message local_190;
  ulong local_188;
  undefined4 local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  Message local_160;
  uint local_158 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  Message local_138 [3];
  uint local_120 [2];
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  int UVSizeInTiles;
  int YSizeInTiles;
  uint32_t RedescribedPitch;
  uint32_t ExpectedPitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_TILE_MODE TileMode;
  TEST_BPP UVbpp;
  TEST_BPP Ybpp;
  GMM_RESOURCE_FORMAT fmt;
  GMM_RESOURCE_FORMAT *__end1;
  GMM_RESOURCE_FORMAT *__begin1;
  GMM_RESOURCE_FORMAT (*__range1) [4];
  GMM_RESOURCE_FORMAT Format [4];
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [5] [2];
  CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test *this_local;
  
  memcpy(&gmmParams.MultiTileArch,&DAT_0022a190,0x28);
  memset(Format + 2,0,0x80);
  Format[2] = GMM_FORMAT_A4B4G4R4_UNORM;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbfffffffd | 0x400000002;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffffffefffff | 0x100000);
  gmmParams.CpTag = 0x100;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth = 0x50;
  gmmParams.field_6.BaseWidth64._4_4_ = 1;
  CTestResource::SetTileFlag((CTestResource *)this,(GMM_RESCREATE_PARAMS *)(Format + 2),TEST_TILEYF)
  ;
  __range1 = (GMM_RESOURCE_FORMAT (*) [4])0x15e0000015d;
  Format[0] = GMM_FORMAT_P010;
  Format[1] = GMM_FORMAT_P016;
  __end1 = (GMM_RESOURCE_FORMAT *)&__range1;
  do {
    if (__end1 == Format + 2) {
      return;
    }
    GVar2 = *__end1;
    Format[3] = GVar2;
    lVar9 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x80))();
    sVar1 = *(short *)(lVar9 + 0x1814 + (ulong)GVar2 * 0x14);
    if (sVar1 == 8) {
      TileMode = TILE_NONE;
      ResourceInfo._4_4_ = 1;
    }
    else {
      if (sVar1 != 0x10) {
        return;
      }
      TileMode = LEGACY_TILE_X;
      ResourceInfo._4_4_ = 2;
    }
    gmmParams._0_8_ = gmmParams._0_8_ & 0xffffffdfffffffff | 0x2000000000;
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,Format + 2);
    uVar4 = gmmParams.CpTag;
    dVar13 = pow(2.0,(double)TileMode);
    uVar3 = TileSize[(ulong)TileMode - 1][0];
    uVar5 = gmmParams.CpTag;
    dVar14 = pow(2.0,(double)TileMode);
    YSizeInTiles = ~(uVar5 * (int)dVar14 + -1 + TileSize[(ulong)TileMode - 1][0] * 4 &
                    TileSize[(ulong)TileMode - 1][0] * 4 - 1) + uVar4 * (int)dVar13 + uVar3 * 4;
    uVar10 = (ulong)gmmParams._40_8_ >> 1;
    dVar13 = pow(2.0,(double)ResourceInfo._4_4_);
    uVar3 = TileSize[(ulong)ResourceInfo._4_4_ - 1][0];
    uVar12 = (ulong)gmmParams._40_8_ >> 1;
    dVar14 = pow(2.0,(double)ResourceInfo._4_4_);
    iVar7 = ((int)uVar10 * (int)dVar13 + uVar3 * 4 + -1) -
            ((int)uVar12 * (int)dVar14 + TileSize[(ulong)ResourceInfo._4_4_ - 1][0] * 4 + -1 &
            TileSize[(ulong)ResourceInfo._4_4_ - 1][0] * 4 - 1);
    if (YSizeInTiles != iVar7) {
      YSizeInTiles = iVar7;
    }
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo_00,YSizeInTiles);
    CTestResource::VerifyResourcePitchInTiles<true>
              ((CTestResource *)this,ResourceInfo_00,
               (uint)YSizeInTiles / TileSize[(ulong)TileMode - 1][0]);
    uVar8 = TileSize[(ulong)TileMode - 1][1];
    gtest_ar.message_.ptr_._4_4_ =
         ((((uVar8 - 1) + gmmParams.field_6.BaseWidth & -uVar8) / uVar8) * iVar7) /
         TileSize[(ulong)TileMode - 1][0];
    uVar8 = TileSize[(ulong)ResourceInfo._4_4_ - 1][1];
    gtest_ar.message_.ptr_._0_4_ =
         ((((uVar8 - 1) + (gmmParams.field_6.BaseWidth >> 1) & -uVar8) / uVar8) * iVar7) /
         TileSize[(ulong)ResourceInfo._4_4_ - 1][0];
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo_00,
               (long)(int)((gtest_ar.message_.ptr_._4_4_ + (uint)gtest_ar.message_.ptr_) * 0x1000));
    uVar8 = TileSize[(ulong)ResourceInfo._4_4_ - 1][0];
    dVar13 = pow(2.0,(double)ResourceInfo._4_4_);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,ResourceInfo_00,(uint32_t)(long)((double)uVar8 / dVar13));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,ResourceInfo_00,TileSize[(ulong)TileMode - 1][1]);
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,ResourceInfo_00,0);
    local_120[1] = 0x10000;
    local_120[0] = (**(code **)(*(long *)ResourceInfo_00 + 0x148))();
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_118,"((64) * 1024)","ResourceInfo->GetBaseAlignment()",
               (int *)(local_120 + 1),local_120);
    bVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar6) {
      testing::Message::Message(local_138);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x540,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    local_158[1] = 0;
    local_158[0] = (**(code **)(*(long *)ResourceInfo_00 + 400))();
    local_158[0] = local_158[0] & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_150,"0",(int *)"ResourceInfo->GetRenderPitchTiles() % 4",local_158 + 1,
               local_158);
    bVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar6) {
      testing::Message::Message(&local_160);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x541,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_160);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_160);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    if (((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 >> 0x12 & 1) != 0) {
      local_17c = 0;
      uVar8 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a0))(ResourceInfo_00,1);
      local_188 = (ulong)(uVar8 & 0xfff);
      testing::internal::EqHelper<true>::Compare<int,unsigned_long>
                ((char *)local_178,"0",
                 (int *)"ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS) % 4096",
                 (unsigned_long *)&local_17c,&local_188);
      bVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
      if (!bVar6) {
        testing::Message::Message(&local_190);
        pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                   ,0x545,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_190);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_190);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
      local_1b0 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a8))(ResourceInfo_00,1);
      local_1b8 = (**(code **)(*(long *)ResourceInfo_00 + 0x280))();
      local_1b8 = local_1b8 >> 8;
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                ((internal *)local_1a8,"ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS)",
                 "ResourceInfo->GetSizeMainSurface() >> 8",&local_1b0,&local_1b8);
      bVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
      if (!bVar6) {
        testing::Message::Message(&local_1c0);
        pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                   ,0x546,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_1c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    }
    local_1dc = 0x2000;
    local_1e8 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a8))(ResourceInfo_00,1);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              ((EqHelper<false> *)local_1d8,"((4) * 1024) * 2",
               "ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS)",&local_1dc,&local_1e8);
    bVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar6) {
      testing::Message::Message(&local_1f0);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&AuxResourceInfo,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x549,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&AuxResourceInfo,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&AuxResourceInfo);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    gmmParams._0_8_ = gmmParams._0_8_ & 0xffffffdfffffffff;
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,Format + 2);
    local_214 = 0x2000;
    local_220 = (**(code **)(*(long *)gtest_ar_5.message_.ptr_ + 0x288))();
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              ((EqHelper<false> *)local_210,"((4) * 1024) * 2","AuxResourceInfo->GetSizeSurface()",
               &local_214,&local_220);
    bVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar6) {
      testing::Message::Message(&local_228);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x551,pcVar11);
      testing::internal::AssertHelper::operator=(&local_230,&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,gtest_ar_5.message_.ptr_);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo_00);
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

TEST_F(CTestGen12dGPUResource, DISABLED_TestPlanarYfCompressedResource)
{
    const uint32_t TileSize[TEST_BPP_MAX][2] = {
    {64, 64}, {128, 32}, {128, 32}, {256, 16}, {256, 16}}; // TileYf

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    //gmmParams.Flags.Gpu.MMC = 1;
    gmmParams.Flags.Gpu.CCS              = 1;
    gmmParams.Flags.Info.MediaCompressed = 1;
    gmmParams.BaseWidth64                = 0x100;
    gmmParams.BaseHeight                 = 0x50;
    gmmParams.Depth                      = 0x1;
    SetTileFlag(gmmParams, TEST_TILEYF); // TileYF only

    //UV-Packed formats
    GMM_RESOURCE_FORMAT Format[4] = {GMM_FORMAT_NV12, GMM_FORMAT_NV21, GMM_FORMAT_P010, GMM_FORMAT_P016};
    for(auto fmt : Format)
    {
        gmmParams.Format = fmt; // 8bpp (NV12, NV21), 16bpp (P016,P010)

        TEST_BPP Ybpp, UVbpp;
        //Yf/Ys could be accessed on CPU/app where UV plane bpp is double
        switch(pGmmULTClientContext->GetPlatformInfo().FormatTable[fmt].Element.BitsPer)
        {
            case 8:
                Ybpp  = TEST_BPP_8;
                UVbpp = TEST_BPP_16;
                break;
            case 16:
                Ybpp  = TEST_BPP_16;
                UVbpp = TEST_BPP_32;
                break;
            default:
                return;
        }
        gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;

        /*Aux is TileY (later Linear), not redescribing, its bytes are allocated using one bpp*/
        GMM_TILE_MODE TileMode = DEFINE_TILE(YF_2D, Ybpp);

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //Redescribed Pitch isn't modified unless Y, UV pitch differ
        //But, original Pitch is padded to have even Tile, hence use Ybpp ExpectedPitch
        //to verify Pitch, but redescribed size
        uint32_t ExpectedPitch    = GMM_ULT_ALIGN(gmmParams.BaseWidth64 * (int)pow(2.0, Ybpp), TileSize[Ybpp][0] * 4);
        uint32_t RedescribedPitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64 / 2 * (int)pow(2.0, UVbpp), TileSize[UVbpp][0] * 4);

        //ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, 2 * TileSize[Ybpp][0]);   //pad to even tile
        if(ExpectedPitch != RedescribedPitch)
        {
            ExpectedPitch = RedescribedPitch;
        }

        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, ExpectedPitch / TileSize[Ybpp][0]);

        int YSizeInTiles = (GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[Ybpp][1]) / TileSize[Ybpp][1]) *
                           RedescribedPitch / TileSize[Ybpp][0];
        int UVSizeInTiles = (GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[UVbpp][1]) / TileSize[UVbpp][1]) *
                            RedescribedPitch / TileSize[UVbpp][0];

        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4) * (YSizeInTiles + UVSizeInTiles));
        VerifyResourceHAlign<true>(ResourceInfo, TileSize[UVbpp][0] / pow(2.0, UVbpp)); // For Yf/Ys planar redescription causes UV width, Y height alignment
        VerifyResourceVAlign<true>(ResourceInfo, TileSize[Ybpp][1]);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-mipped surface

        //test main surface base alignment is 16KB
        //For Yf test main surface pitch is 4-tileYF aligned
        EXPECT_EQ(GMM_KBYTE(64), ResourceInfo->GetBaseAlignment());
        EXPECT_EQ(0, ResourceInfo->GetRenderPitchTiles() % 4); // Check on YF only

        if(const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLinearCCS)
        {
            EXPECT_EQ(0, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS) % PAGE_SIZE);
            EXPECT_GE(ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS), ResourceInfo->GetSizeMainSurface() >> 8);
        }

        EXPECT_EQ(GMM_KBYTE(4) * 2, ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS)); // Y and UV Aux are on separate tiles

        { //separate Aux
            gmmParams.Flags.Gpu.UnifiedAuxSurface = 0;

            GMM_RESOURCE_INFO *AuxResourceInfo;
            AuxResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            EXPECT_EQ(GMM_KBYTE(4) * 2, AuxResourceInfo->GetSizeSurface());

            pGmmULTClientContext->DestroyResInfoObject(AuxResourceInfo);
        }
        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}